

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtIsOnGeodesic.cpp
# Opt level: O0

bool GeoCalcs::PtIsOnGeodesic
               (LLPoint *pt1,LLPoint *pt2,LLPoint *pt3,int lengthCode,PtIsOnGeodesicResult *result)

{
  double dist;
  double dVar1;
  bool bVar2;
  bool local_89;
  undefined1 local_78 [8];
  LLPoint testPt2;
  double crs12;
  double dist12;
  double dist13;
  InverseResult invResult;
  PtIsOnGeodesicResult *result_local;
  int lengthCode_local;
  LLPoint *pt3_local;
  LLPoint *pt2_local;
  LLPoint *pt1_local;
  
  invResult.distance = (double)result;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&dist13);
  bVar2 = DistVincenty(pt1,pt3,(InverseResult *)&dist13);
  dist = invResult.reverseAzimuth;
  if (bVar2) {
    bVar2 = DistVincenty(pt1,pt2,(InverseResult *)&dist13);
    dVar1 = invResult.reverseAzimuth;
    if (bVar2) {
      testPt2.longitude = dist13;
      _local_78 = DestVincenty(pt1,dist13,dist);
      bVar2 = DistVincenty(pt3,(LLPoint *)local_78,(InverseResult *)&dist13);
      if (bVar2) {
        if (0.0005 < invResult.reverseAzimuth) {
          if (lengthCode == 2) {
            _local_78 = DestVincenty(pt1,testPt2.longitude + 3.141592653589793,dist);
            bVar2 = DistVincenty(pt3,(LLPoint *)local_78,(InverseResult *)&dist13);
            if (!bVar2) {
              return false;
            }
            *(uint *)((long)invResult.distance + 0x34) = (uint)(invResult.reverseAzimuth <= 0.0005);
          }
          else {
            *(undefined4 *)((long)invResult.distance + 0x34) = 0;
          }
        }
        else {
          local_89 = 0 < lengthCode || dist - dVar1 <= 0.0005;
          *(uint *)((long)invResult.distance + 0x34) = (uint)local_89;
        }
        *(double *)invResult.distance = pt1->latitude;
        *(double *)((long)invResult.distance + 8) = pt1->longitude;
        *(double *)((long)invResult.distance + 0x10) = pt2->latitude;
        *(double *)((long)invResult.distance + 0x18) = pt2->longitude;
        *(undefined1 (*) [8])((long)invResult.distance + 0x20) = local_78;
        *(double *)((long)invResult.distance + 0x28) = testPt2.latitude;
        *(int *)((long)invResult.distance + 0x30) = lengthCode;
        pt1_local._7_1_ = true;
      }
      else {
        pt1_local._7_1_ = false;
      }
    }
    else {
      pt1_local._7_1_ = false;
    }
  }
  else {
    pt1_local._7_1_ = false;
  }
  return pt1_local._7_1_;
}

Assistant:

bool PtIsOnGeodesic(const LLPoint &pt1, const LLPoint &pt2, const LLPoint &pt3, int lengthCode,
                        PtIsOnGeodesicResult &result)
    {
        InverseResult invResult;
        if (!DistVincenty(pt1, pt3, invResult))
            return false;

        const double dist13 = invResult.distance;

        if (!DistVincenty(pt1, pt2, invResult))
            return false;

        const double dist12 = invResult.distance;
        const double crs12 = invResult.azimuth;

        LLPoint testPt2 = DestVincenty(pt1, crs12, dist13);

        if (!DistVincenty(pt3, testPt2, invResult))
            return false;

        if (invResult.distance <= kTolPtIsOnGeodesic)
        {
            result.result = lengthCode > 0 || dist13 - dist12 <= kTolPtIsOnGeodesic;
        }
        else if (lengthCode == 2)
        {
            testPt2 = DestVincenty(pt1, crs12 + M_PI, dist13);

            if (!DistVincenty(pt3, testPt2, invResult))
                return false;

            result.result = invResult.distance <= kTolPtIsOnGeodesic;
        }
        else
        {
            result.result = false;
        }
        result.geoStart = pt1;
        result.geoEnd = pt2;
        result.geoPt = testPt2;
        result.lengthCode = lengthCode;
        return true;
    }